

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O1

void __thiscall t_html_generator::generate_program(t_html_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppptVar2;
  t_program *ptVar3;
  pointer pcVar4;
  int iVar5;
  int *piVar6;
  long *plVar7;
  ostream *poVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  size_type *psVar10;
  _Alloc_hider _Var11;
  pointer pptVar12;
  pointer pptVar13;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  string fname;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_const_*,_std::allocator<t_const_*>_> local_b0;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<t_service_*,_std::allocator<t_service_*>_> local_68;
  vector<t_const_*,_std::allocator<t_const_*>_> local_48;
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_88,this);
  iVar5 = mkdir(local_88._M_dataplus._M_p,0x1ff);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((iVar5 == -1) && (piVar6 = __errno_location(), *piVar6 != 0x11)) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_68,this);
    std::__cxx11::string::string
              ((string *)&local_b0,
               (char *)local_68.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,&local_89);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_88._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_88._M_dataplus._M_p == psVar10) {
      local_88.field_2._M_allocated_capacity = *psVar10;
      local_88.field_2._8_8_ = plVar7[3];
      local_88._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar10;
    }
    local_88._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    __rhs = strerror(*piVar6);
    std::operator+(__return_storage_ptr__,&local_88,__rhs);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  ptVar3 = (this->super_t_generator).program_;
  pcVar4 = (ptVar3->name_)._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar4,pcVar4 + (ptVar3->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::operator=((string *)&this->current_file_,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_b0,this);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(this->current_file_)._M_dataplus._M_p);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_88.field_2._M_allocated_capacity = *psVar10;
    local_88.field_2._8_8_ = plVar7[3];
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar10;
    local_88._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_88._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ppptVar2 = &local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  if (local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppptVar2) {
    operator_delete(local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::string((string *)&local_b0,local_88._M_dataplus._M_p,(allocator *)&local_68)
  ;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_out_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x70);
  this_00 = &this->f_out_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_out_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90 =
       0;
  if (local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppptVar2) {
    operator_delete(local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"<!DOCTYPE html>",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"<html lang=\"en\">",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"<head>",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "<meta http-equiv=\"Content-Type\" content=\"text/html;charset=utf-8\" />",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_style_tag(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"<title>Thrift module: ",0x16);
  ptVar3 = (this->super_t_generator).program_;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,(ptVar3->name_)._M_dataplus._M_p,
                      (ptVar3->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</title></head><body>",0x15);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<div class=\"container-fluid\">",0x1d);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<h1>Thrift module: ",0x13);
  ptVar3 = (this->super_t_generator).program_;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</h1>",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  print_doc(this,&((this->super_t_generator).program_)->super_t_doc);
  generate_program_toc(this);
  ptVar3 = (this->super_t_generator).program_;
  if ((ptVar3->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar3->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"<hr/><h2 id=\"Constants\">Constants</h2>",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              (&local_b0,&((this->super_t_generator).program_)->consts_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"<table class=\"table-bordered table-striped table-condensed\">",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "<thead><tr><th>Constant</th><th>Type</th><th>Value</th></tr></thead><tbody>",0x4b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&local_48,&local_b0);
    (*(this->super_t_generator)._vptr_t_generator[0x11])(this,&local_48);
    if (local_48.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"</tbody></table>",0x10);
    if (local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  ptVar3 = (this->super_t_generator).program_;
  if ((ptVar3->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar3->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"<hr/><h2 id=\"Enumerations\">Enumerations</h2>",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&local_b0,
               &((this->super_t_generator).program_)->enums_);
    for (pptVar13 = local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        pptVar13 !=
        local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar13);
    }
    if (local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  ptVar3 = (this->super_t_generator).program_;
  if ((ptVar3->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar3->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"<hr/><h2 id=\"Typedefs\">Type declarations</h2>",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&local_b0,
               &((this->super_t_generator).program_)->typedefs_);
    for (pptVar13 = local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        pptVar13 !=
        local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar13);
    }
    if (local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  ptVar3 = (this->super_t_generator).program_;
  if ((ptVar3->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar3->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"<hr/><h2 id=\"Structs\">Data structures</h2>",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&local_b0,
               &((this->super_t_generator).program_)->objects_);
    pptVar13 = local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        iVar5 = (*((*pptVar13)->super_t_doc)._vptr_t_doc[0xc])();
        lVar9 = 0xa8;
        if ((char)iVar5 != '\0') {
          lVar9 = 0xc0;
        }
        (**(code **)((long)(this->super_t_generator)._vptr_t_generator + lVar9))(this,*pptVar13);
        pptVar13 = pptVar13 + 1;
      } while (pptVar13 !=
               local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  ptVar3 = (this->super_t_generator).program_;
  if ((ptVar3->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar3->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"<hr/><h2 id=\"Services\">Services</h2>",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              (&local_68,&((this->super_t_generator).program_)->services_);
    if (local_68.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pptVar12 = local_68.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        (*(this->super_t_generator)._vptr_t_generator[0x1a])((string *)&local_b0,this,*pptVar12);
        std::__cxx11::string::operator=
                  ((string *)&(this->super_t_generator).service_name_,(string *)&local_b0);
        if (local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)ppptVar2) {
          operator_delete(local_b0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar12);
        pptVar12 = pptVar12 + 1;
      } while (pptVar12 !=
               local_68.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_68.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"</div></body></html>",0x14)
  ;
  _Var11 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,(int)_Var11._M_p);
  generate_index(this);
  generate_css(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_html_generator::generate_program() {
  // Make output directory
  MKDIR(get_out_dir().c_str());
  current_file_ = program_->get_name() + ".html";
  string fname = get_out_dir() + current_file_;
  f_out_.open(fname.c_str());
  f_out_ << "<!DOCTYPE html>" << endl;
  f_out_ << "<html lang=\"en\">" << endl;
  f_out_ << "<head>" << endl;
  f_out_ << "<meta http-equiv=\"Content-Type\" content=\"text/html;charset=utf-8\" />" << endl;
  generate_style_tag();
  f_out_ << "<title>Thrift module: " << program_->get_name() << "</title></head><body>" << endl
         << "<div class=\"container-fluid\">" << endl
         << "<h1>Thrift module: " << program_->get_name() << "</h1>" << endl;

  print_doc(program_);

  generate_program_toc();

  if (!program_->get_consts().empty()) {
    f_out_ << "<hr/><h2 id=\"Constants\">Constants</h2>" << endl;
    vector<t_const*> consts = program_->get_consts();
    f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
    f_out_ << "<thead><tr><th>Constant</th><th>Type</th><th>Value</th></tr></thead><tbody>" << endl;
    generate_consts(consts);
    f_out_ << "</tbody></table>";
  }

  if (!program_->get_enums().empty()) {
    f_out_ << "<hr/><h2 id=\"Enumerations\">Enumerations</h2>" << endl;
    // Generate enums
    vector<t_enum*> enums = program_->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      generate_enum(*en_iter);
    }
  }

  if (!program_->get_typedefs().empty()) {
    f_out_ << "<hr/><h2 id=\"Typedefs\">Type declarations</h2>" << endl;
    // Generate typedefs
    vector<t_typedef*> typedefs = program_->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      generate_typedef(*td_iter);
    }
  }

  if (!program_->get_objects().empty()) {
    f_out_ << "<hr/><h2 id=\"Structs\">Data structures</h2>" << endl;
    // Generate structs and exceptions in declared order
    vector<t_struct*> objects = program_->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      if ((*o_iter)->is_xception()) {
        generate_xception(*o_iter);
      } else {
        generate_struct(*o_iter);
      }
    }
  }

  if (!program_->get_services().empty()) {
    f_out_ << "<hr/><h2 id=\"Services\">Services</h2>" << endl;
    // Generate services
    vector<t_service*> services = program_->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      service_name_ = get_service_name(*sv_iter);
      generate_service(*sv_iter);
    }
  }

  f_out_ << "</div></body></html>" << endl;
  f_out_.close();

  generate_index();
  generate_css();
}